

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O0

HeaderField * __thiscall HPack::FieldLookupTable::back(FieldLookupTable *this)

{
  uint uVar1;
  uint uVar2;
  reference pvVar3;
  size_type in_RDI;
  quint32 offset;
  deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
  *unaff_retaddr;
  quint32 chunkIndex;
  quint32 absIndex;
  
  uVar1 = *(int *)(in_RDI + 0x98) - 1;
  uVar2 = uVar1 >> 4;
  std::
  deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
  ::operator[](unaff_retaddr,in_RDI);
  std::
  unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
  ::operator*((unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
               *)CONCAT44(uVar1,uVar2));
  pvVar3 = std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::operator[]
                     ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
                      unaff_retaddr,in_RDI);
  return pvVar3;
}

Assistant:

const HeaderField &FieldLookupTable::back() const
{
    Q_ASSERT(nDynamic && end && end != begin);

    const quint32 absIndex = end - 1;
    const quint32 chunkIndex = absIndex / ChunkSize;
    Q_ASSERT(chunkIndex < chunks.size());
    const quint32 offset = absIndex % ChunkSize;
    return (*chunks[chunkIndex])[offset];
}